

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,const_iterator first,const_iterator last)

{
  void **ppvVar1;
  void **ppvVar2;
  int start;
  
  ppvVar1 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
  ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
  start = (int)((ulong)((long)first.it_ - (long)ppvVar1) >> 3);
  DeleteSubrange(this,start,(int)((ulong)((long)last.it_ - (long)ppvVar2) >> 3) - start);
  ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
  return (iterator)(ppvVar2 + (((long)first.it_ - (long)ppvVar1) * 0x20000000 >> 0x1d));
}

Assistant:

inline typename RepeatedPtrField<Element>::iterator
RepeatedPtrField<Element>::erase(const_iterator first, const_iterator last)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  size_type pos_offset = static_cast<size_type>(std::distance(cbegin(), first));
  size_type last_offset = static_cast<size_type>(std::distance(cbegin(), last));
  DeleteSubrange(pos_offset, last_offset - pos_offset);
  return begin() + pos_offset;
}